

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O1

SSVectorBase<double> * __thiscall
soplex::SSVectorBase<double>::multAdd<double,double>
          (SSVectorBase<double> *this,double xx,SVectorBase<double> *vec)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  bool bVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  Real RVar11;
  double dVar12;
  
  if (this->setupStatus == true) {
    lVar8 = (long)vec->memused;
    if (0 < lVar8) {
      pdVar5 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar9 = lVar8 + 1;
      lVar8 = lVar8 * 0x10 + -8;
      bVar6 = false;
      do {
        iVar3 = *(int *)((long)&vec->m_elem->val + lVar8);
        dVar2 = pdVar5[iVar3];
        dVar12 = *(double *)((long)vec->m_elem + lVar8 + -8) * xx;
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          RVar11 = Tolerances::epsilon((this->_tolerances).
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (ABS(dVar2 + dVar12) <= RVar11) {
            pdVar5[iVar3] = 1e-100;
            bVar6 = true;
          }
          else {
            pdVar5[iVar3] = dVar2 + dVar12;
          }
        }
        else {
          RVar11 = Tolerances::epsilon((this->_tolerances).
                                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          if (RVar11 < ABS(dVar12)) {
            pdVar5[iVar3] = dVar12;
            iVar4 = (this->super_IdxSet).num;
            (this->super_IdxSet).num = iVar4 + 1;
            (this->super_IdxSet).idx[iVar4] = iVar3;
          }
        }
        lVar9 = lVar9 + -1;
        lVar8 = lVar8 + -0x10;
      } while (1 < lVar9);
      if (bVar6) {
        piVar7 = (this->super_IdxSet).idx;
        lVar8 = (long)(this->super_IdxSet).num;
        piVar10 = piVar7;
        if (0 < lVar8) {
          piVar1 = piVar7 + lVar8;
          do {
            dVar2 = pdVar5[*piVar7];
            RVar11 = Tolerances::epsilon((this->_tolerances).
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            if (ABS(dVar2) <= RVar11) {
              pdVar5[*piVar7] = 0.0;
            }
            else {
              *piVar10 = *piVar7;
              piVar10 = piVar10 + 1;
            }
            piVar7 = piVar7 + 1;
          } while (piVar7 < piVar1);
        }
        (this->super_IdxSet).num =
             (int)((ulong)((long)piVar10 - (long)(this->super_IdxSet).idx) >> 2);
      }
    }
  }
  else {
    lVar8 = (long)vec->memused;
    if (0 < lVar8) {
      pdVar5 = (this->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar9 = lVar8 + 1;
      piVar7 = &vec->m_elem[lVar8 + -1].idx;
      do {
        pdVar5[*piVar7] = ((Nonzero<double> *)(piVar7 + -2))->val * xx + pdVar5[*piVar7];
        lVar9 = lVar9 + -1;
        piVar7 = piVar7 + -4;
      } while (1 < lVar9);
    }
  }
  return this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::multAdd(S xx, const SVectorBase<T>& vec)
{
   if(isSetup())
   {
      R* v = VectorBase<R>::val.data();
      R x;
      bool adjust = false;
      int j;

      for(int i = vec.size() - 1; i >= 0; --i)
      {
         j = vec.index(i);

         if(v[j] != 0)
         {
            x = v[j] + xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
               v[j] = x;
            else
            {
               adjust = true;
               v[j] = SOPLEX_VECTOR_MARKER;
            }
         }
         else
         {
            x = xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
            {
               v[j] = x;
               addIdx(j);
            }
         }
      }

      if(adjust)
      {
         int* iptr = idx;
         int* iiptr = idx;
         int* endptr = idx + num;

         for(; iptr < endptr; ++iptr)
         {
            x = v[*iptr];

            if(isNotZero(x, this->tolerances()->epsilon()))
               *iiptr++ = *iptr;
            else
               v[*iptr] = 0;
         }

         num = int(iiptr - idx);
      }
   }
   else
      VectorBase<R>::multAdd(xx, vec);

   assert(isConsistent());

   return *this;
}